

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

void kratos::auto_insert_clock_enable(Generator *top)

{
  undefined1 local_90 [8];
  InsertClockIRVisitor visitor;
  
  InsertClockIRVisitor::InsertClockIRVisitor((InsertClockIRVisitor *)local_90,top);
  IRVisitor::visit_root((IRVisitor *)local_90,&top->super_IRNode);
  local_90 = (undefined1  [8])&PTR_visit_root_004d1628;
  if (visitor.super_IRVisitor.visited_._M_h._M_single_bucket !=
      (__node_base_ptr)&visitor.clk_en_name_._M_string_length) {
    operator_delete(visitor.super_IRVisitor.visited_._M_h._M_single_bucket,
                    visitor.clk_en_name_._M_string_length + 1);
  }
  local_90 = (undefined1  [8])&PTR_visit_root_004cd278;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&visitor.super_IRVisitor.level);
  return;
}

Assistant:

void auto_insert_clock_enable(Generator* top) {
    InsertClockIRVisitor visitor(top);
    visitor.visit_root(top);
}